

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ignore.c
# Opt level: O2

rxc_sink * rxc_sink_ignore(void)

{
  rxc_sink *prVar1;
  
  prVar1 = (rxc_sink *)malloc(0x10);
  if (prVar1 != (rxc_sink *)0x0) {
    prVar1->dealloc = dealloc;
    prVar1->create_logic = create_logic;
  }
  return prVar1;
}

Assistant:

struct rxc_sink * rxc_sink_ignore()
{
    struct rxc_sink *sink = malloc(sizeof(struct rxc_sink));

    if (!sink) {
        return NULL;
    }

    sink->dealloc = dealloc;
    sink->create_logic = create_logic;

    return sink;
}